

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O3

QueueElement * __thiscall
MeCab::FreeList<MeCab::NBestGenerator::QueueElement>::alloc
          (FreeList<MeCab::NBestGenerator::QueueElement> *this)

{
  pointer *pppQVar1;
  ulong uVar2;
  iterator __position;
  QueueElement *pQVar3;
  pointer ppQVar4;
  size_t sVar5;
  ulong uVar6;
  QueueElement *local_30;
  
  uVar6 = this->pi_;
  sVar5 = this->li_;
  uVar2 = this->size;
  if (uVar6 == uVar2) {
    sVar5 = sVar5 + 1;
    this->li_ = sVar5;
    this->pi_ = 0;
    uVar6 = 0;
  }
  ppQVar4 = (this->freeList).
            super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->freeList).
       super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (sVar5 == (long)__position._M_current - (long)ppQVar4 >> 3) {
    local_30 = (QueueElement *)operator_new__(-(ulong)(uVar2 >> 0x3b != 0) | uVar2 << 5);
    if (__position._M_current ==
        (this->freeList).
        super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<MeCab::NBestGenerator::QueueElement*,std::allocator<MeCab::NBestGenerator::QueueElement*>>
      ::_M_realloc_insert<MeCab::NBestGenerator::QueueElement*>
                ((vector<MeCab::NBestGenerator::QueueElement*,std::allocator<MeCab::NBestGenerator::QueueElement*>>
                  *)&this->freeList,__position,&local_30);
      uVar6 = this->pi_;
      sVar5 = this->li_;
    }
    else {
      *__position._M_current = local_30;
      pppQVar1 = &(this->freeList).
                  super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppQVar1 = *pppQVar1 + 1;
    }
    ppQVar4 = (this->freeList).
              super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  pQVar3 = ppQVar4[sVar5];
  this->pi_ = uVar6 + 1;
  return pQVar3 + uVar6;
}

Assistant:

T* alloc() {
    if (pi_ == size) {
      li_++;
      pi_ = 0;
    }
    if (li_ == freeList.size()) freeList.push_back(new T[size]);
    return freeList[li_] + (pi_++);
  }